

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

void __thiscall c4::yml::Parser::_handle_line(Parser *this)

{
  uint uVar1;
  code *pcVar2;
  Location LVar3;
  bool bVar4;
  char msg [53];
  char local_48 [64];
  
  if (((this->m_state->line_contents).rem.len == 0) ||
     ((this->m_state->line_contents).rem.str == (char *)0x0)) {
    builtin_strncpy(local_48,"check failed: (! m_state->line_contents.rem.empty())",0x35);
    if (((s_error_flags & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
      pcVar2 = (code *)swi(3);
      (*pcVar2)();
      return;
    }
    LVar3.super_LineCol.col = 0;
    LVar3.super_LineCol.offset = SUB168(ZEXT816(0x6bfd) << 0x40,0);
    LVar3.super_LineCol.line = SUB168(ZEXT816(0x6bfd) << 0x40,8);
    LVar3.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar3.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              (local_48,0x35,LVar3,(this->m_stack).m_callbacks.m_user_data);
  }
  uVar1 = this->m_state->flags;
  if ((uVar1 & 8) == 0) {
    if ((uVar1 & 4) == 0) {
      if ((uVar1 & 2) == 0) goto LAB_0021cca4;
      bVar4 = _handle_unk(this);
    }
    else if ((uVar1 & 0x10) == 0) {
      bVar4 = _handle_map_blck(this);
    }
    else {
      bVar4 = _handle_map_flow(this);
    }
  }
  else {
    if ((uVar1 & 0x10) != 0) {
      _handle_seq_flow(this);
      return;
    }
    bVar4 = _handle_seq_blck(this);
  }
  if (bVar4 != false) {
    return;
  }
LAB_0021cca4:
  _handle_top(this);
  return;
}

Assistant:

void Parser::_handle_line()
{
    _c4dbgq("\n-----------");
    _c4dbgt("handling line={}, offset={}B", m_state->pos.line, m_state->pos.offset);
    _RYML_CB_ASSERT(m_stack.m_callbacks,  ! m_state->line_contents.rem.empty());
    if(has_any(RSEQ))
    {
        if(has_any(FLOW))
        {
            if(_handle_seq_flow())
                return;
        }
        else
        {
            if(_handle_seq_blck())
                return;
        }
    }
    else if(has_any(RMAP))
    {
        if(has_any(FLOW))
        {
            if(_handle_map_flow())
                return;
        }
        else
        {
            if(_handle_map_blck())
                return;
        }
    }
    else if(has_any(RUNK))
    {
        if(_handle_unk())
            return;
    }

    if(_handle_top())
        return;
}